

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

void ZopfliCacheToSublen(ZopfliLongestMatchCache *lmc,size_t pos,size_t length,
                        unsigned_short *sublen)

{
  byte bVar1;
  unsigned_short uVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar19;
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar37;
  int iVar39;
  undefined1 auVar38 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar42 [16];
  
  auVar11 = _DAT_001293b0;
  auVar10 = _DAT_001293a0;
  auVar9 = _DAT_00129390;
  auVar8 = _DAT_00129380;
  auVar7 = _DAT_00129370;
  puVar3 = lmc->sublen;
  if ((puVar3[pos * 0x18 + 1] == '\0') && (puVar3[pos * 0x18 + 2] == '\0')) {
    uVar15 = 0;
  }
  else {
    uVar15 = puVar3[pos * 0x18 + 0x15] + 3;
  }
  if (2 < length) {
    lVar12 = 0;
    uVar16 = 0;
    do {
      bVar1 = puVar3[lVar12 * 3 + pos * 0x18];
      if (uVar16 <= bVar1 + 3) {
        uVar2 = *(unsigned_short *)(puVar3 + lVar12 * 3 + pos * 0x18 + 1);
        uVar17 = (ulong)uVar16;
        lVar13 = (bVar1 - uVar17) + 3;
        auVar18._8_4_ = (int)lVar13;
        auVar18._0_8_ = lVar13;
        auVar18._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar18 = auVar18 ^ auVar11;
        uVar14 = 0;
        do {
          auVar30._8_4_ = (int)uVar14;
          auVar30._0_8_ = uVar14;
          auVar30._12_4_ = (int)(uVar14 >> 0x20);
          auVar22 = (auVar30 | auVar10) ^ auVar11;
          iVar31 = auVar18._0_4_;
          iVar37 = -(uint)(iVar31 < auVar22._0_4_);
          iVar19 = auVar18._4_4_;
          auVar23._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
          iVar36 = auVar18._8_4_;
          iVar39 = -(uint)(iVar36 < auVar22._8_4_);
          iVar20 = auVar18._12_4_;
          auVar23._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
          auVar33._4_4_ = iVar37;
          auVar33._0_4_ = iVar37;
          auVar33._8_4_ = iVar39;
          auVar33._12_4_ = iVar39;
          auVar40 = pshuflw(in_XMM11,auVar33,0xe8);
          auVar25._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
          auVar25._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          auVar42 = pshuflw(in_XMM12,auVar25,0xe8);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar41 = pshuflw(auVar40,auVar23,0xe8);
          auVar22._8_4_ = 0xffffffff;
          auVar22._0_8_ = 0xffffffffffffffff;
          auVar22._12_4_ = 0xffffffff;
          auVar22 = (auVar41 | auVar42 & auVar40) ^ auVar22;
          auVar22 = packssdw(auVar22,auVar22);
          if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            sublen[uVar17 + uVar14] = uVar2;
          }
          auVar23 = auVar25 & auVar33 | auVar23;
          auVar22 = packssdw(auVar23,auVar23);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar41,auVar22 ^ auVar41);
          if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
            sublen[uVar17 + uVar14 + 1] = uVar2;
          }
          auVar22 = (auVar30 | auVar9) ^ auVar11;
          iVar37 = -(uint)(iVar31 < auVar22._0_4_);
          auVar38._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
          iVar39 = -(uint)(iVar36 < auVar22._8_4_);
          auVar38._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
          auVar24._4_4_ = iVar37;
          auVar24._0_4_ = iVar37;
          auVar24._8_4_ = iVar39;
          auVar24._12_4_ = iVar39;
          auVar32._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
          auVar32._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar38._0_4_ = auVar38._4_4_;
          auVar38._8_4_ = auVar38._12_4_;
          auVar22 = auVar32 & auVar24 | auVar38;
          auVar22 = packssdw(auVar22,auVar22);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar4,auVar22 ^ auVar4);
          if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            sublen[uVar17 + uVar14 + 2] = uVar2;
          }
          auVar25 = pshufhw(auVar24,auVar24,0x84);
          auVar33 = pshufhw(auVar32,auVar32,0x84);
          auVar23 = pshufhw(auVar25,auVar38,0x84);
          auVar26._8_4_ = 0xffffffff;
          auVar26._0_8_ = 0xffffffffffffffff;
          auVar26._12_4_ = 0xffffffff;
          auVar26 = (auVar23 | auVar33 & auVar25) ^ auVar26;
          auVar25 = packssdw(auVar26,auVar26);
          if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            sublen[uVar17 + uVar14 + 3] = uVar2;
          }
          auVar25 = (auVar30 | auVar8) ^ auVar11;
          iVar37 = -(uint)(iVar31 < auVar25._0_4_);
          auVar28._4_4_ = -(uint)(iVar19 < auVar25._4_4_);
          iVar39 = -(uint)(iVar36 < auVar25._8_4_);
          auVar28._12_4_ = -(uint)(iVar20 < auVar25._12_4_);
          auVar34._4_4_ = iVar37;
          auVar34._0_4_ = iVar37;
          auVar34._8_4_ = iVar39;
          auVar34._12_4_ = iVar39;
          auVar22 = pshuflw(auVar22,auVar34,0xe8);
          auVar27._4_4_ = -(uint)(auVar25._4_4_ == iVar19);
          auVar27._12_4_ = -(uint)(auVar25._12_4_ == iVar20);
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar25 = pshuflw(auVar42 & auVar40,auVar27,0xe8);
          in_XMM12 = auVar25 & auVar22;
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar22 = pshuflw(auVar22,auVar28,0xe8);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar40 = (auVar22 | in_XMM12) ^ auVar40;
          in_XMM11 = packssdw(auVar40,auVar40);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            sublen[uVar17 + uVar14 + 4] = uVar2;
          }
          auVar28 = auVar27 & auVar34 | auVar28;
          auVar22 = packssdw(auVar28,auVar28);
          auVar42._8_4_ = 0xffffffff;
          auVar42._0_8_ = 0xffffffffffffffff;
          auVar42._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar42,auVar22 ^ auVar42);
          if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            sublen[uVar17 + uVar14 + 5] = uVar2;
          }
          auVar22 = (auVar30 | auVar7) ^ auVar11;
          iVar31 = -(uint)(iVar31 < auVar22._0_4_);
          auVar35._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
          iVar36 = -(uint)(iVar36 < auVar22._8_4_);
          auVar35._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
          auVar29._4_4_ = iVar31;
          auVar29._0_4_ = iVar31;
          auVar29._8_4_ = iVar36;
          auVar29._12_4_ = iVar36;
          auVar21._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
          auVar21._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar22 = auVar21 & auVar29 | auVar35;
          auVar22 = packssdw(auVar22,auVar22);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar5,auVar22 ^ auVar5);
          if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            sublen[uVar17 + uVar14 + 6] = uVar2;
          }
          auVar30 = pshufhw(auVar29,auVar29,0x84);
          auVar22 = pshufhw(auVar21,auVar21,0x84);
          auVar25 = pshufhw(auVar30,auVar35,0x84);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 & auVar30,(auVar25 | auVar22 & auVar30) ^ auVar6);
          if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            sublen[uVar17 + uVar14 + 7] = uVar2;
          }
          uVar14 = uVar14 + 8;
        } while (((bVar1 - uVar17) + 0xb & 0xfffffffffffffff8) != uVar14);
      }
      if (bVar1 + 3 == uVar15) {
        return;
      }
      uVar16 = bVar1 + 4;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 8);
  }
  return;
}

Assistant:

void ZopfliCacheToSublen(const ZopfliLongestMatchCache* lmc,
                         size_t pos, size_t length,
                         unsigned short* sublen) {
  size_t i, j;
  unsigned maxlength = ZopfliMaxCachedSublen(lmc, pos, length);
  unsigned prevlength = 0;
  unsigned char* cache;
#if ZOPFLI_CACHE_LENGTH == 0
  return;
#endif
  if (length < 3) return;
  cache = &lmc->sublen[ZOPFLI_CACHE_LENGTH * pos * 3];
  for (j = 0; j < ZOPFLI_CACHE_LENGTH; j++) {
    unsigned length = cache[j * 3] + 3;
    unsigned dist = cache[j * 3 + 1] + 256 * cache[j * 3 + 2];
    for (i = prevlength; i <= length; i++) {
      sublen[i] = dist;
    }
    if (length == maxlength) break;
    prevlength = length + 1;
  }
}